

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O1

int archive_write_shar_free(archive_write *a)

{
  void *__ptr;
  
  __ptr = a->format_data;
  if (__ptr != (void *)0x0) {
    archive_entry_free(*(archive_entry **)((long)__ptr + 8));
    free(*(void **)((long)__ptr + 0x18));
    archive_string_free((archive_string *)((long)__ptr + 0x60));
    archive_string_free((archive_string *)((long)__ptr + 0x78));
    free(__ptr);
    a->format_data = (void *)0x0;
  }
  return 0;
}

Assistant:

static int
archive_write_shar_free(struct archive_write *a)
{
	struct shar *shar;

	shar = (struct shar *)a->format_data;
	if (shar == NULL)
		return (ARCHIVE_OK);

	archive_entry_free(shar->entry);
	free(shar->last_dir);
	archive_string_free(&(shar->work));
	archive_string_free(&(shar->quoted_name));
	free(shar);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}